

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sift.cc
# Opt level: O0

void __thiscall features::Sift::extrema_detection(Sift *this)

{
  int iVar1;
  Octave *pOVar2;
  reference pvVar3;
  size_type sVar4;
  const_reference pvVar5;
  shared_ptr<core::Image<float>const> *local_a0;
  shared_ptr<core::Image<float>const> local_58 [8];
  ConstPtr samples [3];
  int s;
  Octave *oct;
  size_t i;
  Sift *this_local;
  
  std::vector<features::Sift::Keypoint,_std::allocator<features::Sift::Keypoint>_>::clear
            (&this->keypoints);
  oct = (Octave *)0x0;
  while( true ) {
    pOVar2 = (Octave *)
             std::vector<features::Sift::Octave,_std::allocator<features::Sift::Octave>_>::size
                       (&this->octaves);
    if (pOVar2 <= oct) break;
    pvVar3 = std::vector<features::Sift::Octave,_std::allocator<features::Sift::Octave>_>::
             operator[](&this->octaves,(size_type)oct);
    samples[2].super___shared_ptr<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi._4_4_ = 0;
    while( true ) {
      iVar1 = samples[2].super___shared_ptr<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi._4_4_;
      sVar4 = std::
              vector<std::shared_ptr<core::Image<float>_>,_std::allocator<std::shared_ptr<core::Image<float>_>_>_>
              ::size(&pvVar3->dog);
      if ((int)sVar4 + -2 <= iVar1) break;
      pvVar5 = std::
               vector<std::shared_ptr<core::Image<float>_>,_std::allocator<std::shared_ptr<core::Image<float>_>_>_>
               ::operator[](&pvVar3->dog,
                            (long)samples[2].
                                  super___shared_ptr<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_refcount._M_pi._4_4_);
      std::shared_ptr<core::Image<float>const>::shared_ptr<core::Image<float>,void>(local_58,pvVar5)
      ;
      pvVar5 = std::
               vector<std::shared_ptr<core::Image<float>_>,_std::allocator<std::shared_ptr<core::Image<float>_>_>_>
               ::operator[](&pvVar3->dog,
                            (long)(samples[2].
                                   super___shared_ptr<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_refcount._M_pi._4_4_ + 1));
      std::shared_ptr<core::Image<float>const>::shared_ptr<core::Image<float>,void>
                ((shared_ptr<core::Image<float>const> *)
                 &samples[0].
                  super___shared_ptr<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount,pvVar5);
      pvVar5 = std::
               vector<std::shared_ptr<core::Image<float>_>,_std::allocator<std::shared_ptr<core::Image<float>_>_>_>
               ::operator[](&pvVar3->dog,
                            (long)(samples[2].
                                   super___shared_ptr<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_refcount._M_pi._4_4_ + 2));
      std::shared_ptr<core::Image<float>const>::shared_ptr<core::Image<float>,void>
                ((shared_ptr<core::Image<float>const> *)
                 &samples[1].
                  super___shared_ptr<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount,pvVar5);
      extrema_detection(this,(ConstPtr *)local_58,(int)oct + (this->options).min_octave,
                        samples[2].
                        super___shared_ptr<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi._4_4_);
      local_a0 = (shared_ptr<core::Image<float>const> *)
                 &samples[2].
                  super___shared_ptr<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount;
      do {
        local_a0 = local_a0 + -0x10;
        std::shared_ptr<const_core::Image<float>_>::~shared_ptr
                  ((shared_ptr<const_core::Image<float>_> *)local_a0);
      } while (local_a0 != local_58);
      samples[2].super___shared_ptr<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi._4_4_ =
           samples[2].super___shared_ptr<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi._4_4_ + 1;
    }
    oct = (Octave *)
          ((long)&(oct->img).
                  super__Vector_base<std::shared_ptr<core::Image<float>_>,_std::allocator<std::shared_ptr<core::Image<float>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + 1);
  }
  return;
}

Assistant:

void
Sift::extrema_detection (void)
{
    /* Delete previous keypoints. */
    this->keypoints.clear();

    /* Detect keypoints in each octave... */
    for (std::size_t i = 0; i < this->octaves.size(); ++i)
    {
        Octave const& oct(this->octaves[i]);
        /* In each octave, take three subsequent DoG images and detect. */
        for (int s = 0; s < (int)oct.dog.size() - 2; ++s)
        {
            core::FloatImage::ConstPtr samples[3] =
            { oct.dog[s + 0], oct.dog[s + 1], oct.dog[s + 2] };
            this->extrema_detection(samples, static_cast<int>(i)
                + this->options.min_octave, s);
        }
    }
}